

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O0

void __thiscall xray_re::xr_object::xr_object(xr_object *this)

{
  allocator<char> local_25 [20];
  allocator<char> local_11;
  xr_object *local_10;
  xr_object *this_local;
  
  local_10 = this;
  xr_surface_factory::xr_surface_factory(&this->super_xr_surface_factory);
  (this->super_xr_surface_factory)._vptr_xr_surface_factory = (_func_int **)&PTR__xr_object_0038cfb0
  ;
  this->m_flags = 0;
  std::__cxx11::string::string((string *)&this->m_userdata);
  std::__cxx11::string::string((string *)&this->m_lod_ref);
  std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::vector
            (&this->m_surfaces);
  std::vector<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>::vector(&this->m_meshes);
  std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::vector(&this->m_bones);
  std::vector<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>::vector
            (&this->m_motions);
  std::__cxx11::string::string((string *)&this->m_motion_refs);
  std::vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>::vector
            (&this->m_partitions);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_owner_name,"unknown",&local_11);
  std::allocator<char>::~allocator(&local_11);
  this->m_creation_time = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_modif_name,"unknown",local_25);
  std::allocator<char>::~allocator(local_25);
  this->m_modified_time = 0;
  this->m_surface_factory = (xr_surface_factory *)0x0;
  std::
  unordered_map<xray_re::xr_raw_surface,_xray_re::xr_surface_*,_std::hash<xray_re::xr_raw_surface>,_std::equal_to<xray_re::xr_raw_surface>,_std::allocator<std::pair<const_xray_re::xr_raw_surface,_xray_re::xr_surface_*>_>_>
  ::unordered_map(&this->m_raw_surfaces);
  _vector3<float>::set(&this->m_position,0.0,0.0,0.0);
  _vector3<float>::set(&this->m_rotation,0.0,0.0,0.0);
  return;
}

Assistant:

xr_object::xr_object(): m_flags(EOF_STATIC),
	m_owner_name("unknown"), m_creation_time(0),
	m_modif_name("unknown"), m_modified_time(0),
	m_surface_factory(0)
{
	m_position.set();
	m_rotation.set();
}